

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformDisjunction(Impl *this,AtomSpan *atoms)

{
  uint32 uVar1;
  Lit_t LVar2;
  uint *puVar3;
  Impl *this_00;
  reference piVar4;
  Span<unsigned_int> *in_RSI;
  int *in_RDI;
  Span<int> SVar5;
  iterator end_1;
  iterator it_1;
  uint32 nRule;
  iterator end;
  iterator it;
  uint32 bIdx;
  pod_vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffb0 [16];
  Impl *local_38;
  uint32 local_30;
  uint *local_20;
  size_type local_14;
  
  local_14 = sizeVec<bk_lib::pod_vector<int,std::allocator<int>>>
                       ((pod_vector<int,_std::allocator<int>_> *)0x19e441);
  local_20 = Potassco::begin<unsigned_int>(in_RSI);
  puVar3 = Potassco::end<unsigned_int>((Span<unsigned_int> *)0x19e462);
  while (local_20 = local_20 + 1, local_20 != puVar3) {
    in_stack_ffffffffffffffa0 = (pod_vector<int,_std::allocator<int>_> *)(in_RDI + 4);
    Potassco::neg(0);
    bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(in_stack_ffffffffffffffb0._0_8_,in_RDI)
    ;
  }
  local_30 = 0;
  local_38 = (Impl *)Potassco::begin<unsigned_int>(in_RSI);
  this_00 = (Impl *)Potassco::end<unsigned_int>((Span<unsigned_int> *)0x19e4d1);
  while( true ) {
    SVar5 = Potassco::toSpan<bk_lib::pod_vector<int,std::allocator<int>>>(in_stack_ffffffffffffffa0)
    ;
    uVar1 = addRule(this_00,SVar5.size._4_4_,(LitSpan *)SVar5.first);
    local_30 = uVar1 + local_30;
    local_38 = (Impl *)((long)&local_38->adapt_ + 4);
    if (local_38 == this_00) break;
    LVar2 = Potassco::neg(0);
    piVar4 = bk_lib::pod_vector<int,_std::allocator<int>_>::operator[]
                       ((pod_vector<int,_std::allocator<int>_> *)(in_RDI + 4),local_14);
    *piVar4 = LVar2;
    local_14 = local_14 + 1;
  }
  return local_30;
}

Assistant:

uint32 RuleTransform::Impl::transformDisjunction(const Potassco::AtomSpan& atoms) {
	uint32 bIdx = sizeVec(lits_);
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms) + 1, end = Potassco::end(atoms); it != end; ++it) {
		lits_.push_back(Potassco::neg(*it));
	}
	uint32 nRule = 0;
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms), end = Potassco::end(atoms);;) {
		nRule += addRule(*it, Potassco::toSpan(lits_));
		if (++it == end) { break; }
		lits_[bIdx++] = Potassco::neg(*(it-1));
	}
	return nRule;
}